

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_term_compute.cpp
# Opt level: O2

void __thiscall
SourceTermCompute::SourceTermCompute
          (SourceTermCompute *this,vector<double,_std::allocator<double>_> *source_term,
          Elements *elements,InterpolationPoints *elem_interp_pts,Tree *elem_tree,Molecule *molecule
          ,InterpolationPoints *mol_interp_pts,Tree *mol_tree,InteractionList *interaction_list,
          double phys_eps_solute)

{
  int iVar1;
  size_type sVar2;
  double dVar3;
  value_type_conflict1 local_38;
  
  (this->super_TreeCompute).source_tree_ = mol_tree;
  (this->super_TreeCompute).target_tree_ = elem_tree;
  (this->super_TreeCompute).interaction_list_ = interaction_list;
  (this->super_TreeCompute)._vptr_TreeCompute =
       (_func_int **)&PTR_particle_particle_interact_0011bd30;
  this->elements_ = elements;
  this->elem_interp_pts_ = elem_interp_pts;
  this->molecule_ = molecule;
  this->mol_interp_pts_ = mol_interp_pts;
  this->one_over_4pi_eps_solute_ = 0.079577471545948 / phys_eps_solute;
  (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elem_interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elem_interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elem_interp_potential_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elem_interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elem_interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elem_interp_potential_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elem_interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elem_interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elem_interp_potential_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elem_interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elem_interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elem_interp_potential_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->source_term_offset_ = (elements->super_Particles).num_;
  this->source_term_ = source_term;
  iVar1 = elem_interp_pts->num_interp_pts_per_node_;
  this->num_elem_interp_pts_per_node_ = iVar1;
  dVar3 = pow((double)iVar1,3.0);
  this->num_elem_interp_potentials_per_node_ = (int)dVar3;
  sVar2 = (long)(int)dVar3 * ((this->super_TreeCompute).target_tree_)->num_nodes_;
  this->num_elem_potentials_ = sVar2;
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->elem_interp_potential_,sVar2,&local_38);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->elem_interp_potential_dx_,this->num_elem_potentials_,&local_38);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->elem_interp_potential_dy_,this->num_elem_potentials_,&local_38);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->elem_interp_potential_dz_,this->num_elem_potentials_,&local_38);
  iVar1 = this->mol_interp_pts_->num_interp_pts_per_node_;
  this->num_mol_interp_pts_per_node_ = iVar1;
  dVar3 = pow((double)iVar1,3.0);
  this->num_mol_interp_charges_per_node_ = (int)dVar3;
  sVar2 = (long)(int)dVar3 * ((this->super_TreeCompute).source_tree_)->num_nodes_;
  this->num_mol_charges_ = sVar2;
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->mol_interp_charge_,sVar2,&local_38);
  return;
}

Assistant:

SourceTermCompute::SourceTermCompute(std::vector<double>& source_term,
                      class Elements& elements, const class InterpolationPoints& elem_interp_pts,
                      const class Tree& elem_tree,
                      const class Molecule& molecule, const class InterpolationPoints& mol_interp_pts,
                      const class Tree& mol_tree,
                      const class InteractionList& interaction_list, double phys_eps_solute)
    : TreeCompute(mol_tree, elem_tree, interaction_list),
      elements_(elements),  elem_interp_pts_(elem_interp_pts),
      molecule_(molecule),  mol_interp_pts_ (mol_interp_pts),
      one_over_4pi_eps_solute_(constants::ONE_OVER_4PI / phys_eps_solute),
      source_term_(source_term), source_term_offset_(elements_.num())
{
//    timers_.ctor.start();
    
    /* Target clusters */
    
    num_elem_interp_pts_per_node_        = elem_interp_pts_.num_interp_pts_per_node();
    num_elem_interp_potentials_per_node_ = std::pow(num_elem_interp_pts_per_node_, 3);
    num_elem_potentials_                 = target_tree_.num_nodes() * num_elem_interp_potentials_per_node_;
    
    elem_interp_potential_   .assign(num_elem_potentials_, 0.);
    elem_interp_potential_dx_.assign(num_elem_potentials_, 0.);
    elem_interp_potential_dy_.assign(num_elem_potentials_, 0.);
    elem_interp_potential_dz_.assign(num_elem_potentials_, 0.);
    
    
    /* Source clusters */
    
    num_mol_interp_pts_per_node_     = mol_interp_pts_.num_interp_pts_per_node();
    num_mol_interp_charges_per_node_ = std::pow(num_mol_interp_pts_per_node_, 3);
    num_mol_charges_                 = source_tree_.num_nodes() * num_mol_interp_charges_per_node_;
    
    mol_interp_charge_.assign(num_mol_charges_, 0.);
    
//    timers_.ctor.stop();
}